

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

bool EV_MovePoly(line_t_conflict *line,int polyNum,double speed,DAngle *angle,double dist,
                bool overRide)

{
  FPolyObj *poly;
  DPolyAction *pDVar1;
  DMovePoly *this;
  bool bVar2;
  TAngle<double> local_1e8;
  double dStack_1e0;
  FPolyMirrorIterator it;
  
  it.CurPoly = PO_GetPolyobj(polyNum);
  if (it.CurPoly == (FPolyObj *)0x0) {
    bVar2 = false;
    Printf("EV_MovePoly: Invalid polyobj num: %d\n",polyNum);
  }
  else {
    it.UsedPolys[0] = (it.CurPoly)->tag;
    it.NumUsedPolys = 1;
    bVar2 = false;
    while (poly = FPolyMirrorIterator::NextMirror(&it), poly != (FPolyObj *)0x0) {
      pDVar1 = GC::ReadBarrier<DPolyAction>((DPolyAction **)&poly->specialdata);
      if (pDVar1 == (DPolyAction *)0x0) {
        if (poly->bBlocked == true && !overRide) {
          return bVar2;
        }
      }
      else if (!overRide) {
        return bVar2;
      }
      this = (DMovePoly *)DObject::operator_new(0x70);
      DMovePoly::DMovePoly(this,poly->tag);
      (poly->specialdata).field_0.p = (DPolyAction *)this;
      poly->bBlocked = false;
      (this->super_DPolyAction).m_Dist = dist;
      (this->super_DPolyAction).m_Speed = speed;
      (this->m_Angle).Degrees = angle->Degrees;
      TAngle<double>::ToVector(&local_1e8,speed);
      (this->m_Speedv).X = local_1e8.Degrees;
      (this->m_Speedv).Y = dStack_1e0;
      SN_StartSequence(poly,poly->seqType,SEQ_DOOR,0,false);
      if (dist / speed <= 2.0) {
        DPolyAction::StopInterpolation((DPolyAction *)this);
      }
      angle->Degrees = angle->Degrees + 180.0;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool EV_MovePoly (line_t *line, int polyNum, double speed, DAngle angle,
				  double dist, bool overRide)
{
	DMovePoly *pe = NULL;
	FPolyObj *poly;
	DAngle an = angle;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_MovePoly: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		pe = new DMovePoly(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		pe->m_Dist = dist; // Distance
		pe->m_Speed = speed;
		pe->m_Angle = angle;
		pe->m_Speedv = angle.ToVector(speed);
		SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);

		// Do not interpolate very fast moving polyobjects. The minimum tic count is
		// 3 instead of 2, because the moving crate effect in Massmouth 2, Hostitality
		// that this fixes isn't quite fast enough to move the crate back to its start
		// in just 1 tic.
		if (dist/speed <= 2)
		{
			pe->StopInterpolation ();
		}

		angle += 180.;	// Reverse the angle.
	}
	return pe != NULL;	// Return true if something started moving.
}